

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

umap * units::getDefinedBaseUnitNames(void)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  umap *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_units::unit,_const_char_*>,_false,_true>,_bool>
  pVar3;
  value_type *name_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  array<std::pair<units::unit,_const_char_*>,_55UL> *__range1_1;
  value_type *name;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::pair<units::unit,_const_char_*>,_113UL> *__range1;
  umap *definedNames;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  _Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true> in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  const_iterator local_60;
  const_iterator local_20;
  
  memset(in_RDI,0,0x38);
  std::
  unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
  ::unordered_map((unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
                   *)0x77259a);
  local_20 = std::array<std::pair<units::unit,_const_char_*>,_113UL>::begin
                       ((array<std::pair<units::unit,_const_char_*>,_113UL> *)0x7725b5);
  pvVar1 = std::array<std::pair<units::unit,_const_char_*>,_113UL>::end
                     ((array<std::pair<units::unit,_const_char_*>,_113UL> *)0x7725c9);
  for (; local_20 != pvVar1; local_20 = local_20 + 1) {
    if (local_20->second != (char *)0x0) {
      pVar3 = std::
              unordered_map<units::unit,char_const*,std::hash<units::unit>,std::equal_to<units::unit>,std::allocator<std::pair<units::unit_const,char_const*>>>
              ::emplace<units::unit_const&,char_const*const&>
                        ((unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                         (unit *)in_stack_ffffffffffffff58._M_cur,
                         (char **)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      in_stack_ffffffffffffff67 = pVar3.second;
    }
  }
  local_60 = std::array<std::pair<units::unit,_const_char_*>,_55UL>::begin
                       ((array<std::pair<units::unit,_const_char_*>,_55UL> *)0x772691);
  pvVar2 = std::array<std::pair<units::unit,_const_char_*>,_55UL>::end
                     ((array<std::pair<units::unit,_const_char_*>,_55UL> *)0x7726a2);
  for (; local_60 != pvVar2; local_60 = local_60 + 1) {
    if (local_60->second != (char *)0x0) {
      pVar3 = std::
              unordered_map<units::unit,char_const*,std::hash<units::unit>,std::equal_to<units::unit>,std::allocator<std::pair<units::unit_const,char_const*>>>
              ::emplace<units::unit_const&,char_const*const&>
                        ((unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                         (unit *)in_stack_ffffffffffffff58._M_cur,
                         (char **)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      in_stack_ffffffffffffff58._M_cur =
           (__node_type *)
           pVar3.first.super__Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true>.
           _M_cur;
      in_stack_ffffffffffffff57 = pVar3.second;
    }
  }
  return in_RDI;
}

Assistant:

static umap getDefinedBaseUnitNames()
{
    umap definedNames{};
    for (const auto& name : defined_unit_names_si) {
        if (name.second != nullptr) {
            definedNames.emplace(name.first, name.second);
        }
    }
    for (const auto& name : defined_unit_names_customary) {
        if (name.second != nullptr) {
            definedNames.emplace(name.first, name.second);
        }
    }
    return definedNames;
}